

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::MergeFrom
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  int iVar1;
  int iVar2;
  LogMessage *other_00;
  long *to;
  long *from;
  LogFinisher local_65;
  int existing_size;
  byte local_51;
  LogMessage local_50;
  RepeatedField<long> *local_18;
  RepeatedField<long> *other_local;
  RepeatedField<long> *this_local;
  
  local_51 = 0;
  local_18 = other;
  other_local = this;
  if (other == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2f1);
    local_51 = 1;
    other_00 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_65,other_00);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (local_18->current_size_ != 0) {
    iVar1 = size(this);
    iVar2 = size(local_18);
    Reserve(this,iVar1 + iVar2);
    iVar2 = size(local_18);
    AddNAlreadyReserved(this,iVar2);
    to = Mutable(this,iVar1);
    from = Get(local_18,0);
    iVar1 = size(local_18);
    CopyArray(this,to,from,iVar1);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ != 0) {
    int existing_size = size();
    Reserve(existing_size + other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(existing_size), &other.Get(0), other.size());
  }
}